

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall lest::to_hex_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char c)

{
  long lVar1;
  ostringstream os;
  undefined1 auStack_1b8 [8];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [50];
  char acStack_b0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\\x",2);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  lVar1 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar1 + 1] == '\0') {
    std::ios::widen((char)auStack_1b8 + (char)lVar1 + '(');
    acStack_b0[lVar1 + 1] = '\x01';
  }
  acStack_b0[lVar1] = '0';
  std::ostream::operator<<((ostream *)local_190,(uint)this & 0xff);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1b0,local_1b0 + local_1a8);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_hex_string(char c)
{
    std::ostringstream os;
    os << "\\x" << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>( static_cast<unsigned char>(c) );
    return os.str();
}